

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  EVP_PKEY_CTX *pEVar1;
  size_t sVar2;
  size_t size_00;
  void *pvVar3;
  upb_Arena *in_RDX;
  byte in_SIL;
  size_t bytes;
  uint32_t size;
  upb_Arena *a_local;
  uint8_t size_lg2_local;
  upb_table *t_local;
  
  if (in_SIL < 0x20) {
    *(undefined4 *)(ctx + 8) = 0;
    *(int *)(ctx + 0xc) = (1 << (in_SIL & 0x1f)) + -1;
    pEVar1 = (EVP_PKEY_CTX *)upb_table_size((upb_table *)ctx);
    if (pEVar1 < (EVP_PKEY_CTX *)0xaaaaaaaaaaaaaab) {
      sVar2 = upb_table_size((upb_table *)ctx);
      size_00 = sVar2 * 0x18;
      if (size_00 == 0) {
        *(undefined8 *)ctx = 0;
      }
      else {
        pvVar3 = upb_Arena_Malloc(in_RDX,size_00);
        *(void **)ctx = pvVar3;
        if (*(long *)ctx == 0) {
          t_local._7_1_ = 0;
          goto LAB_004bfd4e;
        }
        ctx = (EVP_PKEY_CTX *)memset(*(void **)ctx,0,size_00);
      }
      t_local._7_1_ = 1;
    }
    else {
      t_local._7_1_ = 0;
      ctx = pEVar1;
    }
  }
  else {
    t_local._7_1_ = 0;
    ctx = (EVP_PKEY_CTX *)0x0;
  }
LAB_004bfd4e:
  return (int)CONCAT71((int7)((ulong)ctx >> 8),t_local._7_1_);
}

Assistant:

static bool init(upb_table* t, uint8_t size_lg2, upb_Arena* a) {
  if (size_lg2 >= 32) {
    return false;
  }
  t->count = 0;
  uint32_t size = 1 << size_lg2;
  t->mask = size - 1;  // 0 mask if size_lg2 is 0
  if (upb_table_size(t) > (SIZE_MAX / sizeof(upb_tabent))) {
    return false;
  }
  size_t bytes = upb_table_size(t) * sizeof(upb_tabent);
  if (bytes > 0) {
    t->entries = upb_Arena_Malloc(a, bytes);
    if (!t->entries) return false;
    memset(t->entries, 0, bytes);
  } else {
    t->entries = NULL;
  }
  return true;
}